

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.hpp
# Opt level: O1

bool __thiscall ProtocolBase::isValid(ProtocolBase *this,uint8_t *buf,size_t n)

{
  long lVar1;
  char *pcVar2;
  uint8_t uVar3;
  
  if ((*buf == 0x90) && (buf[1] == 0xeb)) {
    if ((ulong)buf[3] + 5 != n) {
      pcVar2 = "WARNING::ProtocolWrite::Frame length is not suitable";
      lVar1 = 0x34;
      goto LAB_0010e3d5;
    }
    if (n == 3) {
      uVar3 = '\0';
    }
    else {
      lVar1 = 0;
      uVar3 = '\0';
      do {
        uVar3 = uVar3 + buf[lVar1 + 2];
        lVar1 = lVar1 + 1;
      } while (n - 3 != lVar1);
    }
    if (buf[n - 1] == uVar3) {
      return true;
    }
    pcVar2 = "WARNING::ProtocolWrite::Checksum is not suitable";
  }
  else {
    pcVar2 = "WARNING::ProtcolWrite::Frame header not suitable";
  }
  lVar1 = 0x30;
LAB_0010e3d5:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar2,lVar1);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  return false;
}

Assistant:

bool isValid(uint8_t *buf, size_t n) {
        if ((buf[0] != HEADER_RET_1) || (buf[1] != HEADER_RET_2)) {
            std::cout << "WARNING::ProtcolWrite::Frame header not suitable" << std::endl;
            return false;
        }
        if (n != (buf[3] + 5)) {
            std::cout << "WARNING::ProtocolWrite::Frame length is not suitable" << std::endl;
            return false;
        }

        if (buf[n - 1] != getChecksum(&buf[2], n - 3)) {
            std::cout << "WARNING::ProtocolWrite::Checksum is not suitable" << std::endl;
            return false;
        }

        return true;
    }